

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::BackgroundFinishMark(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (this->inPartialCollectMode == false) {
    bVar2 = DoQueueTrackedObject(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x162d,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                         "this->inPartialCollectMode || this->DoQueueTrackedObject()");
      if (!bVar2) goto LAB_0068620a;
      *puVar3 = 0;
    }
  }
  if ((this->collectionState).value != CollectionStateConcurrentFinishMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1631,"(collectionState == CollectionStateConcurrentFinishMark)",
                       "collectionState == CollectionStateConcurrentFinishMark");
    if (!bVar2) {
LAB_0068620a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sVar4 = FinishMarkRescan(this,true);
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateConcurrentFindRoots);
  sVar5 = BackgroundFindRoots(this);
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateConcurrentFinishMark);
  ProcessMark(this,false);
  return sVar5 + sVar4 * 0x1000;
}

Assistant:

size_t
Recycler::BackgroundFinishMark()
{
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif
    Assert(collectionState == CollectionStateConcurrentFinishMark);
    size_t rescannedRootBytes = FinishMarkRescan(true) * AutoSystemInfo::PageSize;
    this->SetCollectionState(CollectionStateConcurrentFindRoots);
    rescannedRootBytes += this->BackgroundFindRoots();
    this->SetCollectionState(CollectionStateConcurrentFinishMark);
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::MarkPhase);
    ProcessMark(true);
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::MarkPhase);
    return rescannedRootBytes;
}